

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O3

void cos1D_predict<IMLE<1,1,FastLinearExpert>>(IMLE<1,_1,_FastLinearExpert> *imleObj)

{
  result_type_conflict1 rVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  X *pXVar5;
  ostream *poVar6;
  ulong uVar7;
  value_type_conflict *__x;
  long lVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uniform_01<double,_double> uniform;
  vector<double,_std::allocator<double>_> invSol;
  mt19937 rng;
  new_uniform_01<double> local_a29;
  double *local_a28;
  pointer local_a20;
  vector<double,_std::allocator<double>_> local_a18;
  ulong local_a00;
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  local_9f8;
  
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(&local_9f8,
         &boost::random::
          mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>
          ::default_seed);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t --- Forward Prediction (random input locations): ---",0x36);
  iVar9 = 10;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  do {
    rVar1 = boost::random::detail::new_uniform_01<double>::operator()(&local_a29,&local_9f8);
    local_a28 = (double *)(rVar1 * 4.0 * 3.141592653589793);
    local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_a28;
    pXVar5 = IMLE<1,_1,_FastLinearExpert>::predict(imleObj,(Z *)&local_a18);
    local_a20 = (pointer)(pXVar5->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
                         m_storage.m_data.array[0];
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t cos(",6);
    poVar6 = std::ostream::_M_insert<double>((double)local_a28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = ",4);
    dVar2 = cos((double)local_a28);
    poVar6 = std::ostream::_M_insert<double>(dVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tpred(",6);
    poVar6 = std::ostream::_M_insert<double>((double)local_a28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = ",4);
    poVar6 = std::ostream::_M_insert<double>((double)local_a20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  (error = ",0xb);
    dVar2 = cos((double)local_a28);
    poVar6 = std::ostream::_M_insert<double>(dVar2 - (double)local_a20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\t\t    Jacobian(",0xf);
    poVar6 = std::ostream::_M_insert<double>((double)local_a28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = ",4);
    dVar2 = sin((double)local_a28);
    poVar6 = std::ostream::_M_insert<double>(-dVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\t\tpredJacobian(",0xf);
    poVar6 = std::ostream::_M_insert<double>((double)local_a28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = ",4);
    IMLE<1,_1,_FastLinearExpert>::getMultiplePredictionsJacobian(imleObj);
    poVar6 = std::ostream::_M_insert<double>
                       ((double)(imleObj->predictionsJacobian).
                                super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                .
                                super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[imleObj->solIdx].
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                                m_storage);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t --- Inverse Prediction (random output locations): ---",0x37);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  local_a00 = 0;
  do {
    rVar1 = boost::random::detail::new_uniform_01<double>::operator()(&local_a29,&local_9f8);
    local_a20 = (pointer)(rVar1 + rVar1 + -1.0);
    local_a28 = (double *)acos((double)local_a20);
    local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_a20;
    IMLE<1,_1,_FastLinearExpert>::predictInverse(imleObj,(X *)&local_a18);
    local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    iVar9 = imleObj->nInvSolFound;
    lVar10 = (long)iVar9;
    if (0 < lVar10) {
      lVar8 = 0;
      do {
        __x = (value_type_conflict *)
              ((long)&(((imleObj->invPredictions).
                        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                        .
                        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage +
              lVar8);
        if (local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                    (&local_a18,
                     (iterator)
                     local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,__x);
        }
        else {
          *local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = *__x;
          local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        pdVar4 = local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pdVar3 = local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 8;
      } while (lVar10 * 8 - lVar8 != 0);
      if (local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar7 = (long)local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        lVar8 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pdVar3,pdVar4);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tinvCos(",8);
    poVar6 = std::ostream::_M_insert<double>((double)local_a20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = ( ",6);
    poVar6 = std::ostream::_M_insert<double>((double)local_a28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(6.283185307179586 - (double)local_a28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>((double)local_a28 + 6.283185307179586);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(12.566370614359172 - (double)local_a28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," )",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t  pred(",8);
    poVar6 = std::ostream::_M_insert<double>((double)local_a20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = ( ",6);
    if (0 < iVar9) {
      lVar8 = 0;
      do {
        poVar6 = std::ostream::_M_insert<double>
                           (local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar8]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        lVar8 = lVar8 + 1;
      } while (lVar10 != lVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    uVar7 = local_a00;
    if (local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    uVar11 = (int)uVar7 + 1;
    local_a00 = (ulong)uVar11;
  } while (uVar11 != 10);
  return;
}

Assistant:

void cos1D_predict( Learner &imleObj)
{
    // Random number generation
    boost::mt19937 rng;
    boost::uniform_01<Scal> uniform;
    // Query dataset size
    const int NPOINTS_QUERY = 10;
    // Input and output Eigen vectors
    Vec z(1), x(1);

    // Forward Prediction
    cout << "\t --- Forward Prediction (random input locations): ---" << endl;
    for(int k = 0; k < NPOINTS_QUERY; k++)
    {
        z[0] = uniform(rng) * 4*M_PI;

        x = imleObj.predict(z);
        // Alternatively:
        //      imleObj.predict();
        //      x = getPrediction()[0];

        cout << "\t cos(" << z[0] << ") = " << cos(z[0]) << endl;
        cout << "\tpred(" << z[0] << ") = " << x[0] << "  (error = " << cos(z[0])-x[0] << ")" << endl;
        cout << "\t\t    Jacobian(" << z[0] << ") = " << -sin(z[0]) << endl;
        cout << "\t\tpredJacobian(" << z[0] << ") = " << imleObj.getPredictionJacobian()(0,0) << endl;
    }

    // Inverse Prediction
    cout << "\t --- Inverse Prediction (random output locations): ---" << endl;
    for(int k = 0; k < NPOINTS_QUERY; k++)
    {
        x[0] = uniform(rng) * 2.0 - 1.0;
        Scal inv_x = acos(x[0]);

        imleObj.predictInverse(x);

        vector<Scal> invSol;
        int nSol = imleObj.getNumberOfInverseSolutionsFound();
        for( int k = 0; k < nSol; k++ )
            invSol.push_back( imleObj.getInversePredictions()[k][0] );
        sort(invSol.begin(), invSol.end() );

        cout << "\tinvCos(" << x[0] << ") = ( " << inv_x << ", " << 2.0*M_PI-inv_x << ", " << 2.0*M_PI+inv_x << ", " << 4.0*M_PI-inv_x << " )" << endl;
        cout << "\t  pred(" << x[0] << ") = ( ";
        for( int k = 0; k < nSol; k++ )
            cout << invSol[k] << ", ";
        cout << ")" << endl;
    }
}